

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O3

void duckdb::TupleDataTemplatedWithinCollectionScatter<unsigned_int>
               (Vector *param_1,TupleDataVectorFormat *source_format,SelectionVector *append_sel,
               idx_t append_count,TupleDataLayout *param_5,Vector *param_6,Vector *heap_locations,
               idx_t param_8,UnifiedVectorFormat *list_data,
               vector<duckdb::TupleDataScatterFunction,_true> *param_10)

{
  SelectionVector *pSVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  byte bVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  TemplatedValidityData<unsigned_char> *pTVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  idx_t iVar14;
  idx_t iVar15;
  long *plVar16;
  _Head_base<0UL,_unsigned_char_*,_false> _Var17;
  ulong uVar18;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_true> local_60;
  ulong local_50;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  ulong local_38;
  
  if (append_count != 0) {
    pSVar1 = list_data->sel;
    pdVar2 = list_data->data;
    pSVar3 = (source_format->unified).sel;
    pdVar4 = (source_format->unified).data;
    pdVar5 = heap_locations->data;
    iVar14 = 0;
    do {
      iVar15 = iVar14;
      if (append_sel->sel_vector != (sel_t *)0x0) {
        iVar15 = (idx_t)append_sel->sel_vector[iVar14];
      }
      psVar6 = pSVar1->sel_vector;
      if (psVar6 != (sel_t *)0x0) {
        iVar15 = (idx_t)psVar6[iVar15];
      }
      puVar7 = (list_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar7 == (unsigned_long *)0x0) || ((puVar7[iVar15 >> 6] >> (iVar15 & 0x3f) & 1) != 0)) {
        uVar13 = *(ulong *)(pdVar2 + iVar15 * 0x10 + 8);
        if (uVar13 != 0) {
          _Var17._M_head_impl = *(uchar **)(pdVar5 + iVar14 * 8);
          local_60.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_60.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_50 = uVar13;
          if (_Var17._M_head_impl == (uchar *)0x0) {
            local_38 = uVar13;
            make_buffer<duckdb::TemplatedValidityData<unsigned_char>,unsigned_long&>
                      ((duckdb *)&local_48,&local_38);
            p_Var9 = p_Stack_40;
            local_60.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = local_48;
            this._M_pi = local_60.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
            local_48 = (element_type *)0x0;
            p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_60.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var9;
            if ((this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi),
               p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_true>::operator->
                                (&local_60);
            _Var17._M_head_impl =
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          }
          lVar11 = (uVar13 + 7 >> 3) - 1;
          if (lVar11 != 0) {
            lVar12 = 0;
            do {
              _Var17._M_head_impl[lVar12] = 0xff;
              lVar12 = lVar12 + 1;
            } while (lVar11 != lVar12);
          }
          plVar16 = (long *)(pdVar2 + iVar15 * 0x10);
          _Var17._M_head_impl[lVar11] =
               _Var17._M_head_impl[lVar11] | -((uVar13 & 7) == 0) | ~(-1 << ((byte)uVar13 & 7));
          lVar11 = plVar16[1];
          lVar12 = (lVar11 + 7U >> 3) + *(long *)(pdVar5 + iVar14 * 8);
          *(long *)(pdVar5 + iVar14 * 8) = lVar12 + lVar11 * 4;
          if (lVar11 != 0) {
            uVar13 = 0;
            do {
              uVar18 = *plVar16 + uVar13;
              psVar6 = pSVar3->sel_vector;
              if (psVar6 != (sel_t *)0x0) {
                uVar18 = (ulong)psVar6[uVar18];
              }
              puVar7 = (source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                       validity_mask;
              if ((puVar7 == (unsigned_long *)0x0) ||
                 ((puVar7[uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0)) {
                *(undefined4 *)(lVar12 + uVar13 * 4) = *(undefined4 *)(pdVar4 + uVar18 * 4);
              }
              else {
                bVar8 = (byte)uVar13 & 7;
                _Var17._M_head_impl[uVar13 >> 3] =
                     _Var17._M_head_impl[uVar13 >> 3] & (-2 << bVar8 | 0xfeU >> 8 - bVar8);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < (ulong)plVar16[1]);
          }
          if (local_60.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_60.internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 != append_count);
  }
  return;
}

Assistant:

static void TupleDataTemplatedWithinCollectionScatter(const Vector &, const TupleDataVectorFormat &source_format,
                                                      const SelectionVector &append_sel, const idx_t append_count,
                                                      const TupleDataLayout &, const Vector &, Vector &heap_locations,
                                                      const idx_t, const UnifiedVectorFormat &list_data,
                                                      const vector<TupleDataScatterFunction> &) {
	// Parent list data
	const auto &list_sel = *list_data.sel;
	const auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	const auto &list_validity = list_data.validity;

	// Source
	const auto &source_data = source_format.unified;
	const auto &source_sel = *source_data.sel;
	const auto data = UnifiedVectorFormat::GetData<T>(source_data);
	const auto &source_validity = source_data.validity;

	// Target
	const auto target_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	for (idx_t i = 0; i < append_count; i++) {
		const auto list_idx = list_sel.get_index(append_sel.get_index(i));
		if (!list_validity.RowIsValid(list_idx)) {
			continue; // Original list entry is invalid - no need to serialize the child
		}

		// Get the current list entry
		const auto &list_entry = list_entries[list_idx];
		const auto &list_offset = list_entry.offset;
		const auto &list_length = list_entry.length;
		if (list_length == 0) {
			continue;
		}

		// Initialize validity mask and skip heap pointer over it
		auto &target_heap_location = target_heap_locations[i];
		ValidityBytes child_mask(target_heap_location, list_length);
		child_mask.SetAllValid(list_length);
		target_heap_location += ValidityBytes::SizeInBytes(list_length);

		// Get the start to the fixed-size data and skip the heap pointer over it
		const auto child_data_location = target_heap_location;
		target_heap_location += list_length * TupleDataWithinListFixedSize<T>();

		// Store the data and validity belonging to this list entry
		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			const auto child_source_idx = source_sel.get_index(list_offset + child_i);
			if (source_validity.RowIsValid(child_source_idx)) {
				TupleDataWithinListValueStore<T>(data[child_source_idx],
				                                 child_data_location + child_i * TupleDataWithinListFixedSize<T>(),
				                                 target_heap_location);
			} else {
				child_mask.SetInvalidUnsafe(child_i);
			}
		}
	}
}